

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O0

void __thiscall
CRegexParser::get_match_length
          (CRegexParser *this,re_state_id init,re_state_id final,int *minlen,int *maxlen,
          regex_scan_frame *stack)

{
  undefined4 *puVar1;
  int iVar2;
  int *in_RCX;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  int *in_R8;
  regex_scan_frame *in_R9;
  int gmax;
  int gmin;
  re_tuple *gt;
  re_state_id gexit;
  re_state_id genter;
  re_state_id g;
  int loopmax;
  int loopmin;
  int max2;
  int max1;
  int min2;
  int min1;
  re_tuple *t;
  re_state_id i;
  regex_scan_frame fr;
  int in_stack_ffffffffffffff4c;
  int *in_stack_ffffffffffffff50;
  int *local_78;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_3c;
  int local_38;
  regex_scan_frame *in_stack_ffffffffffffffd0;
  int iVar3;
  
  local_3c = in_ESI;
  regex_scan_frame::regex_scan_frame((regex_scan_frame *)&local_38,in_R9);
  *in_R8 = 0;
  *in_RCX = 0;
  iVar3 = local_3c;
  do {
    if (local_3c == in_EDX) {
      return;
    }
    local_38 = local_3c;
    puVar1 = (undefined4 *)(*(long *)(in_RDI + 2) + (long)local_3c * 0x28);
    *(byte *)(puVar1 + 8) = *(byte *)(puVar1 + 8) | 8;
    switch(*puVar1) {
    case 4:
      if (puVar1[7] != -1) {
        iVar2 = regex_scan_frame::is_recursing((regex_scan_frame *)&local_38);
        if (iVar2 != 0) {
          *in_R8 = -1;
          return;
        }
        get_match_length((CRegexParser *)CONCAT44(iVar3,in_EDX),(re_state_id)((ulong)in_RCX >> 0x20)
                         ,(re_state_id)in_RCX,in_R8,&in_R9->st,in_stack_ffffffffffffffd0);
        get_match_length((CRegexParser *)CONCAT44(iVar3,in_EDX),(re_state_id)((ulong)in_RCX >> 0x20)
                         ,(re_state_id)in_RCX,in_R8,&in_R9->st,in_stack_ffffffffffffffd0);
        gml_min(local_4c,local_50);
        gml_add(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
        gml_max(local_54,local_58);
        gml_add(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
        return;
      }
      local_3c = puVar1[6];
      break;
    default:
      gml_add(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      gml_add(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      local_3c = puVar1[6];
      break;
    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
    case 0xd:
    case 0xe:
    case 0x11:
    case 0x12:
    case 0x1f:
    case 0x20:
    case 0x21:
    case 0x22:
    case 0x23:
      local_3c = puVar1[6];
      break;
    case 0x13:
      iVar2 = regex_scan_frame::is_recursing((regex_scan_frame *)&local_38);
      if (iVar2 == 0) {
        local_64 = 0;
        local_78 = *(int **)(in_RDI + 2);
        local_6c = -1;
        local_68 = -1;
        for (; local_64 < *in_RDI; local_64 = local_64 + 1) {
          if ((*local_78 == 0x11) && (local_78[2] == puVar1[2])) {
            local_68 = local_64;
          }
          else if ((*local_78 == 0x12) && (local_78[2] == puVar1[2])) {
            local_6c = local_64;
          }
          local_78 = local_78 + 10;
        }
        if ((-1 < local_68) && (-1 < local_6c)) {
          get_match_length((CRegexParser *)CONCAT44(iVar3,in_EDX),
                           (re_state_id)((ulong)in_RCX >> 0x20),(re_state_id)in_RCX,in_R8,&in_R9->st
                           ,in_stack_ffffffffffffffd0);
          gml_add(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
          gml_add(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
        }
      }
      else {
        *in_R8 = -1;
      }
      local_3c = puVar1[6];
      break;
    case 0x24:
      iVar2 = regex_scan_frame::is_recursing((regex_scan_frame *)&local_38);
      if (iVar2 == 0) {
        in_stack_ffffffffffffff50 = in_RCX;
        get_match_length((CRegexParser *)CONCAT44(iVar3,in_EDX),(re_state_id)((ulong)in_RCX >> 0x20)
                         ,(re_state_id)in_RCX,in_R8,&in_R9->st,in_stack_ffffffffffffffd0);
        in_RCX = in_stack_ffffffffffffff50;
        gml_mul(local_5c,puVar1[2]);
        gml_add(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
        gml_mul(local_60,puVar1[3]);
        gml_add(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      }
      else {
        *in_R8 = -1;
      }
      local_3c = puVar1[7];
    }
  } while( true );
}

Assistant:

void CRegexParser::get_match_length(re_state_id init, re_state_id final,
                                    int *minlen, int *maxlen,
                                    regex_scan_frame *stack)
{
    /* set up a stack frame in case we need to recurse */
    regex_scan_frame fr(stack);

    /* start with zero lengths */
    *minlen = *maxlen = 0;

    /* iterate through the machine */
    for (re_state_id i = init ; i != final ; )
    {
        /* remember the current state in our stack frame */
        fr.st = i;

        /* get this tuple */
        re_tuple *t = &tuple_arr_[i];

        /* mark this state as visited, to detect infinite loops */
        t->flags |= RE_STATE_CYCLE_TEST;

        /* check what we have */
        switch (t->typ)
        {
        case RE_TEXT_BEGIN:
        case RE_TEXT_END:
        case RE_LOOKBACK_POS:
        case RE_WORD_BEGIN:
        case RE_WORD_END:
        case RE_WORD_BOUNDARY:
        case RE_NON_WORD_BOUNDARY:
        case RE_GROUP_ENTER:
        case RE_GROUP_EXIT:
        case RE_ASSERT_POS:
        case RE_ASSERT_NEG:
        case RE_ASSERT_BACKPOS:
        case RE_ASSERT_BACKNEG:
        case RE_ZERO_VAR:
            /* 
             *   assertions, group entries, and loop entries contribute
             *   nothing to the match length - continue to the onward branch 
             */
            i = t->next_state_1;
            break;

        case RE_EPSILON:
            /* 
             *   for single-transition epsilons, simply proceed to the next
             *   state 
             */
            if (t->next_state_2 == RE_STATE_INVALID)
            {
                i = t->next_state_1;
                break;
            }

            /*
             *   Epsilon transitions have two lengths: the length of the
             *   first branch, and the length of the second branch.
             *   Calculate the two branches separately, and take the lower of
             *   the minimum values and the higher of the maximum values.
             *   
             *   Before recursing, check to see if we're looping.  If we've
             *   recursed from the current state already in this search,
             *   we're in a loop, so we have a maximum length of infinity.  
             */
            if (fr.is_recursing())
            {
                /* we're looping, so we have an unbounded maximum length */
                *maxlen = -1;
            }
            else
            {
                /* 
                 *   we're not looping yet, so we can recursively calculate
                 *   the length of each sub-branch 
                 */
                int min1, min2, max1, max2;
                get_match_length(t->next_state_1, final, &min1, &max1, &fr);
                get_match_length(t->next_state_2, final, &min2, &max2, &fr);
                
                /* add the lower min and the higher max to the total */
                gml_add(minlen, gml_min(min1, min2));
                gml_add(maxlen, gml_max(max1, max2));
            }

            /* we've fully considered both branches, so we're done */
            return;

        case RE_LOOP_BRANCH:
            /*
             *   A loop branch contributes (min..max) * the length of the
             *   "enter" branch (the first epsilon transition).  Check that
             *   we're not recursing first; if so, we have an unbounded
             *   maximum length.  
             */
            if (fr.is_recursing())
            {
                /* looping - the maximum is unbounded */
                *maxlen = -1;
            }
            else
            {
                /* 
                 *   Calculate the length of the loop branch.  Note that the
                 *   loop ends at the current state. 
                 */
                int loopmin, loopmax;
                get_match_length(t->next_state_1, i, &loopmin, &loopmax, &fr);

                /* add the loop min and max to the running total */
                gml_add(minlen, gml_mul(loopmin, t->info.loop.loop_min));
                gml_add(maxlen, gml_mul(loopmax, t->info.loop.loop_max));
            }

            /* continue from the post-loop state */
            i = t->next_state_2;
            break;

        case RE_GROUP_MATCH:
            /*
             *   A group matcher matches the same length as its corresponding
             *   group.  Find the group entry state, then measure its length
             *   and use it as the result.
             *   
             *   As usual, before recursively calculating the group length,
             *   we need to make sure we're not recursing from the current
             *   state.  
             */
            if (fr.is_recursing())
            {
                /* looping, so the length of this branch is unbounded */
                *maxlen = -1;
            }
            else
            {
                /* locate the enter/exit states for the group */
                re_state_id g, genter, gexit;
                re_tuple *gt;
                for (g = 0, gt = tuple_arr_, genter = gexit = -1 ;
                     g < next_state_ ; ++g, ++gt)
                {
                    if (gt->typ == RE_GROUP_ENTER
                        && gt->info.ch == t->info.ch)
                        genter = g;
                    else if (gt->typ == RE_GROUP_EXIT
                             && gt->info.ch == t->info.ch)
                        gexit = g;
                }

                /* if we found the group, figure its length */
                if (genter >= 0 && gexit >= 0)
                {
                    /* figure the group length range */
                    int gmin, gmax;
                    get_match_length(genter, gexit, &gmin, &gmax, &fr);

                    /* add the group min and max to the running totals */
                    gml_add(minlen, gmin);
                    gml_add(maxlen, gmax);
                }
            }

            /* move on to the next state */
            i = t->next_state_1;
            break;
        
        default:
            /* everything else matches a single character */
            gml_add(minlen, 1);
            gml_add(maxlen, 1);

            /* on to the next state */
            i = t->next_state_1;
            break;
        }
    }
}